

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.h
# Opt level: O0

void __thiscall MeshLib::VertexInHalfedgeIterator::operator++(VertexInHalfedgeIterator *this)

{
  TopologyException *this_00;
  tHalfEdge pHVar1;
  tHalfEdge pHVar2;
  VertexInHalfedgeIterator *this_local;
  
  if (this->m_halfedge == (tHalfEdge)0x0) {
    this_00 = (TopologyException *)__cxa_allocate_exception(8);
    TopologyException::TopologyException(this_00,"iterators");
    __cxa_throw(this_00,&TopologyException::typeinfo,TopologyException::~TopologyException);
  }
  pHVar2 = this->m_halfedge;
  pHVar1 = Solid::vertexMostCcwInHalfEdge(this->m_solid,this->m_vertex);
  if (pHVar2 == pHVar1) {
    this->m_halfedge = (tHalfEdge)0x0;
  }
  else {
    pHVar2 = Solid::vertexNextCcwInHalfEdge(this->m_solid,this->m_halfedge);
    this->m_halfedge = pHVar2;
  }
  return;
}

Assistant:

void operator++()
	{
		if( m_halfedge == NULL ) throw TopologyException("iterators"); 
		 if( m_halfedge == m_solid->vertexMostCcwInHalfEdge(m_vertex) ) 
			 m_halfedge = NULL; 
		else
			m_halfedge = m_solid->vertexNextCcwInHalfEdge(m_halfedge); 
	}